

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void aom_filter_block1d16_h4_ssse3
               (uint8_t *src_ptr,ptrdiff_t src_pixels_per_line,uint8_t *output_ptr,
               ptrdiff_t output_pitch,uint32_t output_height,int16_t *filter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 (*in_R9) [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i secondFilters;
  __m128i filt3Reg;
  __m128i filt2Reg;
  __m128i addFilterReg32;
  __m128i filtersReg;
  int local_40c;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 *local_330;
  undefined1 (*local_320) [16];
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short sStack_310;
  short sStack_30e;
  short sStack_30c;
  short sStack_30a;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  uint i;
  __m128i srcReg32b2;
  __m128i srcReg32b1;
  __m128i srcRegFilt32b3;
  __m128i srcRegFilt32b2;
  __m128i srcRegFilt32b2_1;
  __m128i srcRegFilt32b1_1;
  __m128i thirdFilters;
  
  local_320 = (undefined1 (*) [16])(in_RDI + -3);
  auVar4 = psraw(*in_R9,ZEXT416(1));
  auVar5 = packsswb(auVar4,auVar4);
  auVar6._8_8_ = 0x302030203020302;
  auVar6._0_8_ = 0x302030203020302;
  auVar6 = pshufb(auVar5,auVar6);
  auVar4._8_8_ = 0x504050405040504;
  auVar4._0_8_ = 0x504050405040504;
  auVar4 = pshufb(auVar5,auVar4);
  local_330 = in_RDX;
  for (local_40c = in_R8D; local_40c != 0; local_40c = local_40c + -1) {
    auVar1[8] = '\x06';
    auVar1[9] = '\a';
    auVar1[10] = '\a';
    auVar1[0xb] = '\b';
    auVar1[0xc] = '\b';
    auVar1[0xd] = '\t';
    auVar1[0xe] = '\t';
    auVar1[0xf] = '\n';
    auVar1[0] = '\x02';
    auVar1[1] = '\x03';
    auVar1[2] = '\x03';
    auVar1[3] = '\x04';
    auVar1[4] = '\x04';
    auVar1[5] = '\x05';
    auVar1[6] = '\x05';
    auVar1[7] = '\x06';
    auVar5 = pshufb(*local_320,auVar1);
    auVar8[8] = '\b';
    auVar8[9] = '\t';
    auVar8[10] = '\t';
    auVar8[0xb] = '\n';
    auVar8[0xc] = '\n';
    auVar8[0xd] = '\v';
    auVar8[0xe] = '\v';
    auVar8[0xf] = '\f';
    auVar8[0] = '\x04';
    auVar8[1] = '\x05';
    auVar8[2] = '\x05';
    auVar8[3] = '\x06';
    auVar8[4] = '\x06';
    auVar8[5] = '\a';
    auVar8[6] = '\a';
    auVar8[7] = '\b';
    auVar7 = pshufb(*local_320,auVar8);
    auVar5 = pmaddubsw(auVar5,auVar6);
    auVar7 = pmaddubsw(auVar7,auVar4);
    auVar8 = paddsw(auVar5,auVar7);
    auVar7[8] = '\x06';
    auVar7[9] = '\a';
    auVar7[10] = '\a';
    auVar7[0xb] = '\b';
    auVar7[0xc] = '\b';
    auVar7[0xd] = '\t';
    auVar7[0xe] = '\t';
    auVar7[0xf] = '\n';
    auVar7[0] = '\x02';
    auVar7[1] = '\x03';
    auVar7[2] = '\x03';
    auVar7[3] = '\x04';
    auVar7[4] = '\x04';
    auVar7[5] = '\x05';
    auVar7[6] = '\x05';
    auVar7[7] = '\x06';
    auVar7 = pshufb(*(undefined1 (*) [16])(*local_320 + 8),auVar7);
    auVar5[8] = '\b';
    auVar5[9] = '\t';
    auVar5[10] = '\t';
    auVar5[0xb] = '\n';
    auVar5[0xc] = '\n';
    auVar5[0xd] = '\v';
    auVar5[0xe] = '\v';
    auVar5[0xf] = '\f';
    auVar5[0] = '\x04';
    auVar5[1] = '\x05';
    auVar5[2] = '\x05';
    auVar5[3] = '\x06';
    auVar5[4] = '\x06';
    auVar5[5] = '\a';
    auVar5[6] = '\a';
    auVar5[7] = '\b';
    auVar5 = pshufb(*(undefined1 (*) [16])(*local_320 + 8),auVar5);
    auVar7 = pmaddubsw(auVar7,auVar6);
    auVar5 = pmaddubsw(auVar5,auVar4);
    auVar5 = paddsw(auVar7,auVar5);
    auVar3._8_8_ = 0x20002000200020;
    auVar3._0_8_ = 0x20002000200020;
    auVar7 = paddsw(auVar8,auVar3);
    auVar2._8_8_ = 0x20002000200020;
    auVar2._0_8_ = 0x20002000200020;
    auVar5 = paddsw(auVar5,auVar2);
    auVar7 = psraw(auVar7,ZEXT416(6));
    auVar5 = psraw(auVar5,ZEXT416(6));
    local_308 = auVar7._0_2_;
    sStack_306 = auVar7._2_2_;
    sStack_304 = auVar7._4_2_;
    sStack_302 = auVar7._6_2_;
    sStack_300 = auVar7._8_2_;
    sStack_2fe = auVar7._10_2_;
    sStack_2fc = auVar7._12_2_;
    sStack_2fa = auVar7._14_2_;
    local_318 = auVar5._0_2_;
    sStack_316 = auVar5._2_2_;
    sStack_314 = auVar5._4_2_;
    sStack_312 = auVar5._6_2_;
    sStack_310 = auVar5._8_2_;
    sStack_30e = auVar5._10_2_;
    sStack_30c = auVar5._12_2_;
    sStack_30a = auVar5._14_2_;
    local_3b8._0_2_ =
         CONCAT11((0 < sStack_306) * (sStack_306 < 0x100) * auVar7[2] - (0xff < sStack_306),
                  (0 < local_308) * (local_308 < 0x100) * auVar7[0] - (0xff < local_308));
    local_3b8._0_3_ =
         CONCAT12((0 < sStack_304) * (sStack_304 < 0x100) * auVar7[4] - (0xff < sStack_304),
                  (undefined2)local_3b8);
    local_3b8._0_4_ =
         CONCAT13((0 < sStack_302) * (sStack_302 < 0x100) * auVar7[6] - (0xff < sStack_302),
                  (undefined3)local_3b8);
    local_3b8._0_5_ =
         CONCAT14((0 < sStack_300) * (sStack_300 < 0x100) * auVar7[8] - (0xff < sStack_300),
                  (undefined4)local_3b8);
    local_3b8._0_6_ =
         CONCAT15((0 < sStack_2fe) * (sStack_2fe < 0x100) * auVar7[10] - (0xff < sStack_2fe),
                  (undefined5)local_3b8);
    local_3b8._0_7_ =
         CONCAT16((0 < sStack_2fc) * (sStack_2fc < 0x100) * auVar7[0xc] - (0xff < sStack_2fc),
                  (undefined6)local_3b8);
    local_3b8 = CONCAT17((0 < sStack_2fa) * (sStack_2fa < 0x100) * auVar7[0xe] - (0xff < sStack_2fa)
                         ,(undefined7)local_3b8);
    uStack_3b0._0_1_ = (0 < local_318) * (local_318 < 0x100) * auVar5[0] - (0xff < local_318);
    uStack_3b0._1_1_ = (0 < sStack_316) * (sStack_316 < 0x100) * auVar5[2] - (0xff < sStack_316);
    uStack_3b0._2_1_ = (0 < sStack_314) * (sStack_314 < 0x100) * auVar5[4] - (0xff < sStack_314);
    uStack_3b0._3_1_ = (0 < sStack_312) * (sStack_312 < 0x100) * auVar5[6] - (0xff < sStack_312);
    uStack_3b0._4_1_ = (0 < sStack_310) * (sStack_310 < 0x100) * auVar5[8] - (0xff < sStack_310);
    uStack_3b0._5_1_ = (0 < sStack_30e) * (sStack_30e < 0x100) * auVar5[10] - (0xff < sStack_30e);
    uStack_3b0._6_1_ = (0 < sStack_30c) * (sStack_30c < 0x100) * auVar5[0xc] - (0xff < sStack_30c);
    uStack_3b0._7_1_ = (0 < sStack_30a) * (sStack_30a < 0x100) * auVar5[0xe] - (0xff < sStack_30a);
    local_320 = (undefined1 (*) [16])(*local_320 + in_RSI);
    *local_330 = local_3b8;
    local_330[1] = uStack_3b0;
    local_330 = (undefined8 *)(in_RCX + (long)local_330);
  }
  return;
}

Assistant:

static void aom_filter_block1d16_h4_ssse3(
    const uint8_t *src_ptr, ptrdiff_t src_pixels_per_line, uint8_t *output_ptr,
    ptrdiff_t output_pitch, uint32_t output_height, const int16_t *filter) {
  __m128i filtersReg;
  __m128i addFilterReg32, filt2Reg, filt3Reg;
  __m128i secondFilters, thirdFilters;
  __m128i srcRegFilt32b1_1, srcRegFilt32b2_1, srcRegFilt32b2, srcRegFilt32b3;
  __m128i srcReg32b1, srcReg32b2;
  unsigned int i;
  src_ptr -= 3;
  addFilterReg32 = _mm_set1_epi16(32);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  filtersReg = _mm_srai_epi16(filtersReg, 1);
  // converting the 16 bit (short) to 8 bit (byte) and have the same data
  // in both lanes of 128 bit register.
  filtersReg = _mm_packs_epi16(filtersReg, filtersReg);

  // duplicate only the second 16 bits (third and forth byte)
  // across 256 bit register
  secondFilters = _mm_shuffle_epi8(filtersReg, _mm_set1_epi16(0x302u));
  // duplicate only the third 16 bits (fifth and sixth byte)
  // across 256 bit register
  thirdFilters = _mm_shuffle_epi8(filtersReg, _mm_set1_epi16(0x504u));

  filt2Reg = _mm_load_si128((__m128i const *)(filt_h4 + 32));
  filt3Reg = _mm_load_si128((__m128i const *)(filt_h4 + 32 * 2));

  for (i = output_height; i > 0; i -= 1) {
    srcReg32b1 = _mm_loadu_si128((const __m128i *)src_ptr);

    // filter the source buffer
    srcRegFilt32b3 = _mm_shuffle_epi8(srcReg32b1, filt2Reg);
    srcRegFilt32b2 = _mm_shuffle_epi8(srcReg32b1, filt3Reg);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt32b3 = _mm_maddubs_epi16(srcRegFilt32b3, secondFilters);
    srcRegFilt32b2 = _mm_maddubs_epi16(srcRegFilt32b2, thirdFilters);

    srcRegFilt32b1_1 = _mm_adds_epi16(srcRegFilt32b3, srcRegFilt32b2);

    // reading stride of the next 16 bytes
    // (part of it was being read by earlier read)
    srcReg32b2 = _mm_loadu_si128((const __m128i *)(src_ptr + 8));

    // filter the source buffer
    srcRegFilt32b3 = _mm_shuffle_epi8(srcReg32b2, filt2Reg);
    srcRegFilt32b2 = _mm_shuffle_epi8(srcReg32b2, filt3Reg);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt32b3 = _mm_maddubs_epi16(srcRegFilt32b3, secondFilters);
    srcRegFilt32b2 = _mm_maddubs_epi16(srcRegFilt32b2, thirdFilters);

    // add and saturate the results together
    srcRegFilt32b2_1 = _mm_adds_epi16(srcRegFilt32b3, srcRegFilt32b2);

    // shift by 6 bit each 16 bit
    srcRegFilt32b1_1 = _mm_adds_epi16(srcRegFilt32b1_1, addFilterReg32);
    srcRegFilt32b2_1 = _mm_adds_epi16(srcRegFilt32b2_1, addFilterReg32);
    srcRegFilt32b1_1 = _mm_srai_epi16(srcRegFilt32b1_1, 6);
    srcRegFilt32b2_1 = _mm_srai_epi16(srcRegFilt32b2_1, 6);

    // shrink to 8 bit each 16 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve result
    srcRegFilt32b1_1 = _mm_packus_epi16(srcRegFilt32b1_1, srcRegFilt32b2_1);

    src_ptr += src_pixels_per_line;

    _mm_store_si128((__m128i *)output_ptr, srcRegFilt32b1_1);

    output_ptr += output_pitch;
  }
}